

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_dart_validator(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *this_00;
  t_struct *ptVar1;
  bool bVar2;
  e_req eVar3;
  uint uVar4;
  ostream *poVar5;
  t_type *ttype;
  reference pptVar6;
  string *psVar7;
  string local_208;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  undefined1 local_140 [8];
  string field_name_1;
  t_type *type;
  t_field *field;
  t_field **local_108;
  string local_100;
  allocator local_d9;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  string field_name;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_68;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  allocator local_41;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar5,"validate()");
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40," ",&local_41);
  scope_up(this,(ostream *)ptVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  f_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_68);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar5 = std::operator<<(poVar5,"// check for required fields");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  local_68._M_current =
       (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  while( true ) {
    field_name.field_2._8_8_ =
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_name.field_2 + 8));
    if (!bVar2) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    eVar3 = t_field::get_req(*pptVar6);
    if (eVar3 == T_REQUIRED) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
      std::__cxx11::string::string((string *)&local_b8,(string *)psVar7);
      get_member_name((string *)local_98,this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      ttype = t_field::get_type(*pptVar6);
      bVar2 = type_can_be_null(this,ttype);
      if (bVar2) {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar5 = std::operator<<(poVar5,"if (");
        poVar5 = std::operator<<(poVar5,(string *)local_98);
        std::operator<<(poVar5," == null)");
        ptVar1 = tstruct_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d8," ",&local_d9);
        scope_up(this,(ostream *)ptVar1,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar5 = std::operator<<(poVar5,
                                 "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field \'"
                                );
        poVar5 = std::operator<<(poVar5,(string *)local_98);
        poVar5 = std::operator<<(poVar5,"\' was not present! Struct: \" + toString());");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        ptVar1 = tstruct_local;
        std::__cxx11::string::string((string *)&local_100,(string *)&::endl_abi_cxx11_);
        scope_down(this,(ostream *)ptVar1,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
      }
      else {
        poVar5 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar5 = std::operator<<(poVar5,"// alas, we cannot check \'");
        poVar5 = std::operator<<(poVar5,(string *)local_98);
        poVar5 = std::operator<<(poVar5,
                                 "\' because it\'s a primitive and you chose the non-beans generator."
                                );
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)local_98);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_68);
  }
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar5 = std::operator<<(poVar5,"// check that fields of type enum have valid values");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  local_108 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_68._M_current = local_108;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    ptVar1 = tstruct_local;
    if (!bVar2) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    this_00 = *pptVar6;
    field_name_1.field_2._8_8_ = t_field::get_type(this_00);
    uVar4 = (*(((t_type *)field_name_1.field_2._8_8_)->super_t_doc)._vptr_t_doc[10])();
    if ((uVar4 & 1) != 0) {
      psVar7 = t_field::get_name_abi_cxx11_(this_00);
      std::__cxx11::string::string((string *)&local_160,(string *)psVar7);
      get_member_name((string *)local_140,this,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar5 = std::operator<<(poVar5,"if (");
      generate_isset_check_abi_cxx11_(&local_180,this,this_00);
      poVar5 = std::operator<<(poVar5,(string *)&local_180);
      poVar5 = std::operator<<(poVar5," && !");
      get_ttype_class_name_abi_cxx11_(&local_1a0,this,(t_type *)field_name_1.field_2._8_8_);
      poVar5 = std::operator<<(poVar5,(string *)&local_1a0);
      poVar5 = std::operator<<(poVar5,".VALID_VALUES.contains(");
      poVar5 = std::operator<<(poVar5,(string *)local_140);
      std::operator<<(poVar5,"))");
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_180);
      ptVar1 = tstruct_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0," ",&local_1c1);
      scope_up(this,(ostream *)ptVar1,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar5 = std::operator<<(poVar5,
                               "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"The field \'"
                              );
      poVar5 = std::operator<<(poVar5,(string *)local_140);
      poVar5 = std::operator<<(poVar5,"\' has been assigned the invalid value ");
      poVar5 = std::operator<<(poVar5,"$");
      poVar5 = std::operator<<(poVar5,(string *)local_140);
      poVar5 = std::operator<<(poVar5,"\");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      ptVar1 = tstruct_local;
      std::__cxx11::string::string((string *)&local_1e8,(string *)&::endl_abi_cxx11_);
      scope_down(this,(ostream *)ptVar1,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)local_140);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_68);
  }
  std::__cxx11::string::string((string *)&local_208,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  return;
}

Assistant:

void t_dart_generator::generate_dart_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "validate()";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      string field_name = get_member_name((*f_iter)->get_name());
      if (type_can_be_null((*f_iter)->get_type())) {
        indent(out) << "if (" << field_name << " == null)";
        scope_up(out);
        indent(out) << "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field '"
                    << field_name << "' was not present! Struct: \" + toString());"
                    << endl;
        scope_down(out);
      } else {
        indent(out) << "// alas, we cannot check '" << field_name
                    << "' because it's a primitive and you chose the non-beans generator." << endl;
      }
    }
  }

  // check that fields of type enum have valid values
  indent(out) << "// check that fields of type enum have valid values" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    t_type* type = field->get_type();
    // if field is an enum, check that its value is valid
    if (type->is_enum()) {
      string field_name = get_member_name(field->get_name());
      indent(out) << "if (" << generate_isset_check(field) << " && !" << get_ttype_class_name(type)
                  << ".VALID_VALUES.contains(" << field_name << "))";
      scope_up(out);
      indent(out) << "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"The field '"
                  << field_name << "' has been assigned the invalid value "
                  << "$" << field_name << "\");" << endl;
      scope_down(out);
    }
  }

  scope_down(out, endl2);
}